

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O3

void libyuv::ScaleAddCols1_C
               (int dst_width,int boxheight,int x,int dx,uint16_t *src_ptr,uint8_t *dst_ptr)

{
  int iVar1;
  uint16_t *puVar2;
  uint32_t sum;
  int iVar3;
  int x_1;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = 1;
  if (1 < dx >> 0x10) {
    uVar4 = (ulong)(uint)(dx >> 0x10);
  }
  iVar1 = 0;
  if (0 < dst_width) {
    puVar2 = src_ptr + (x >> 0x10);
    do {
      uVar5 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + (uint)puVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
      *dst_ptr = (uint8_t)((uint)(iVar3 * (int)(0x10000 / (long)(boxheight * (int)uVar4))) >> 0x10);
      dst_ptr = dst_ptr + 1;
      iVar1 = iVar1 + 1;
      puVar2 = puVar2 + uVar4;
    } while (iVar1 != dst_width);
  }
  return;
}

Assistant:

static void ScaleAddCols1_C(int dst_width,
                            int boxheight,
                            int x,
                            int dx,
                            const uint16_t* src_ptr,
                            uint8_t* dst_ptr) {
  int boxwidth = MIN1(dx >> 16);
  int scaleval = 65536 / (boxwidth * boxheight);
  int i;
  x >>= 16;
  for (i = 0; i < dst_width; ++i) {
    *dst_ptr++ = SumPixels(boxwidth, src_ptr + x) * scaleval >> 16;
    x += boxwidth;
  }
}